

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

string * __thiscall
QPDFFormFieldObjectHelper::getAlternativeName_abi_cxx11_
          (string *__return_storage_ptr__,QPDFFormFieldObjectHelper *this)

{
  BaseHandle *pBVar1;
  bool bVar2;
  allocator<char> local_61;
  undefined1 local_60 [32];
  string local_40 [32];
  
  pBVar1 = &(this->super_QPDFObjectHelper).super_BaseHandle;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_60,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"/TU",&local_61);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_60 + 0x10),(string *)local_60);
  bVar2 = QPDFObjectHandle::isString((QPDFObjectHandle *)(local_60 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 0x18));
  std::__cxx11::string::~string(local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  if (bVar2) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_60,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
    std::__cxx11::string::string<std::allocator<char>>(local_40,"/TU",&local_61);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_60 + 0x10),(string *)local_60);
    QPDFObjectHandle::getUTF8Value_abi_cxx11_
              (__return_storage_ptr__,(QPDFObjectHandle *)(local_60 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 0x18));
    std::__cxx11::string::~string(local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  }
  else {
    getFullyQualifiedName_abi_cxx11_(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFFormFieldObjectHelper::getAlternativeName()
{
    if (oh().getKey("/TU").isString()) {
        QTC::TC("qpdf", "QPDFFormFieldObjectHelper TU present");
        return oh().getKey("/TU").getUTF8Value();
    }
    QTC::TC("qpdf", "QPDFFormFieldObjectHelper TU absent");
    return getFullyQualifiedName();
}